

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaAllocator_T::FlushOrInvalidateAllocation
          (VmaAllocator_T *this,VmaAllocation hAllocation,VkDeviceSize offset,VkDeviceSize size,
          VMA_CACHE_OPERATION op)

{
  bool bVar1;
  VkResult VVar2;
  long lVar3;
  VkMappedMemoryRange memRange;
  VkMappedMemoryRange local_38;
  
  local_38.memory = (VkDeviceMemory)0x0;
  local_38.offset = 0;
  local_38.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_38._4_4_ = 0;
  local_38.pNext = (void *)0x0;
  local_38.size = 0;
  bVar1 = GetFlushOrInvalidateRange(this,hAllocation,offset,size,&local_38);
  VVar2 = VK_SUCCESS;
  if (bVar1) {
    if (op == VMA_CACHE_FLUSH) {
      lVar3 = 0x1688;
    }
    else {
      if (op != VMA_CACHE_INVALIDATE) {
        return VK_SUCCESS;
      }
      lVar3 = 0x1690;
    }
    VVar2 = (**(code **)(&this->m_UseMutex + lVar3))(this->m_hDevice,1,&local_38);
  }
  return VVar2;
}

Assistant:

VkResult VmaAllocator_T::FlushOrInvalidateAllocation(
    VmaAllocation hAllocation,
    VkDeviceSize offset, VkDeviceSize size,
    VMA_CACHE_OPERATION op)
{
    VkResult res = VK_SUCCESS;

    VkMappedMemoryRange memRange = {};
    if(GetFlushOrInvalidateRange(hAllocation, offset, size, memRange))
    {
        switch(op)
        {
        case VMA_CACHE_FLUSH:
            res = (*GetVulkanFunctions().vkFlushMappedMemoryRanges)(m_hDevice, 1, &memRange);
            break;
        case VMA_CACHE_INVALIDATE:
            res = (*GetVulkanFunctions().vkInvalidateMappedMemoryRanges)(m_hDevice, 1, &memRange);
            break;
        default:
            VMA_ASSERT(0);
        }
    }
    // else: Just ignore this call.
    return res;
}